

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

void google::protobuf::internal::WireFormat::SerializeMessageSetItemWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0xb);
  }
  else {
    *output->buffer_ = '\v';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0x10);
  }
  else {
    *output->buffer_ = '\x10';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  uVar4 = *(uint *)(field + 0x38);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar4);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar8 = pbVar1;
    uVar9 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar8 = (byte)uVar4 | 0x80;
        uVar9 = uVar4 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar2 = 0x3fff < uVar4;
        uVar4 = uVar9;
      } while (bVar2);
    }
    *pbVar8 = (byte)uVar9;
    iVar7 = ((int)pbVar8 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar7;
    output->buffer_size_ = output->buffer_size_ - iVar7;
  }
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0x1a);
  }
  else {
    *output->buffer_ = '\x1a';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar3),message,field,0);
  uVar6 = (**(code **)(*plVar5 + 0x78))(plVar5);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,(uint)uVar6);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar8 = pbVar1;
    if ((uint)uVar6 < 0x80) {
      uVar6 = uVar6 & 0xffffffff;
    }
    else {
      uVar10 = uVar6 & 0xffffffff;
      do {
        uVar4 = (uint)uVar6;
        *pbVar8 = (byte)uVar6 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar8 = pbVar8 + 1;
        uVar10 = uVar6;
      } while (0x3fff < uVar4);
    }
    *pbVar8 = (byte)uVar6;
    iVar3 = ((int)pbVar8 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  (**(code **)(*plVar5 + 0x68))(plVar5,output);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,0xc);
    return;
  }
  *output->buffer_ = '\f';
  output->buffer_ = output->buffer_ + 1;
  output->buffer_size_ = output->buffer_size_ + -1;
  return;
}

Assistant:

void WireFormat::SerializeMessageSetItemWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  // Start group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  output->WriteVarint32(WireFormatLite::kMessageSetTypeIdTag);
  output->WriteVarint32(field->number());

  // Write message.
  output->WriteVarint32(WireFormatLite::kMessageSetMessageTag);

  const Message& sub_message = message_reflection->GetMessage(message, field);
  output->WriteVarint32(sub_message.GetCachedSize());
  sub_message.SerializeWithCachedSizes(output);

  // End group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemEndTag);
}